

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_135f2b2::ObmcSadTest_ExtremeValues_Test::TestBody
          (ObmcSadTest_ExtremeValues_Test *this)

{
  bool bVar1;
  undefined4 uVar2;
  char *in_RDI;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  uint tst_res;
  uint ref_res;
  int i;
  int pre_stride;
  int iter;
  int32_t mask [16384];
  int32_t wsrc [16384];
  uint8_t pre [16384];
  AssertHelper *in_stack_fffffffffffdbf28;
  uint *in_stack_fffffffffffdbf30;
  char *in_stack_fffffffffffdbf38;
  uint in_stack_fffffffffffdbf44;
  Type in_stack_fffffffffffdbf54;
  uint uVar3;
  AssertHelper *in_stack_fffffffffffdbf58;
  AssertionResult aAStack_24098 [2];
  undefined1 auStack_24072 [18];
  Message *in_stack_fffffffffffdbfa0;
  undefined4 in_stack_fffffffffffdbfa8;
  undefined4 uVar4;
  int iStack_2404c;
  int iStack_24044;
  undefined4 auStack_24040 [16384];
  undefined4 auStack_14040 [16384];
  undefined1 local_4040 [16440];
  
  iStack_24044 = 0;
  while( true ) {
    in_stack_fffffffffffdbf44 = in_stack_fffffffffffdbf44 & 0xffffff;
    if (iStack_24044 < 0x80) {
      bVar1 = testing::Test::HasFatalFailure();
      in_stack_fffffffffffdbf44 = CONCAT13(bVar1,(int3)in_stack_fffffffffffdbf44) ^ 0xff000000;
    }
    if ((in_stack_fffffffffffdbf44 & 0x1000000) == 0) {
      return;
    }
    for (iStack_2404c = 0; iStack_2404c < 0x4000; iStack_2404c = iStack_2404c + 1) {
      local_4040[iStack_2404c] = 0xff;
      auStack_14040[iStack_2404c] = 0xff000;
      auStack_24040[iStack_2404c] = 0x1000;
    }
    (**(code **)(in_RDI + 0x20))(local_4040,iStack_24044,auStack_14040,auStack_24040);
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)&aAStack_24098[2].field_0x6);
    uVar2 = (**(code **)(in_RDI + 0x28))(local_4040,iStack_24044,auStack_14040,auStack_24040);
    uVar4 = uVar2;
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xbd1f09);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffdbf44,uVar2),in_stack_fffffffffffdbf38,
               in_stack_fffffffffffdbf30,(uint *)in_stack_fffffffffffdbf28);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(aAStack_24098);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffdbf58);
      in_stack_fffffffffffdbf38 =
           testing::AssertionResult::failure_message((AssertionResult *)0xbd1f79);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffdbf58,in_stack_fffffffffffdbf54,in_RDI,
                 in_stack_fffffffffffdbf44,in_stack_fffffffffffdbf38);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(uVar4,in_stack_fffffffffffdbfa8),in_stack_fffffffffffdbfa0
                );
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffdbf28);
      testing::Message::~Message((Message *)0xbd1fc7);
    }
    uVar3 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbd2027);
    if (uVar3 != 0) break;
    iStack_24044 = iStack_24044 + 1;
    in_stack_fffffffffffdbf54 = kSuccess;
  }
  return;
}

Assistant:

TEST_P(ObmcSadTest, ExtremeValues) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < MAX_SB_SIZE && !HasFatalFailure(); ++iter) {
    const int pre_stride = iter;

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = UINT8_MAX;
      wsrc[i] = UINT8_MAX * kMaskMax * kMaskMax;
      mask[i] = kMaskMax * kMaskMax;
    }

    const unsigned int ref_res = params_.ref_func(pre, pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(tst_res =
                                 params_.tst_func(pre, pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}